

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

void asmjit::_SetBits(size_t *buf,size_t index,size_t len)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  
  if (len != 0) {
    uVar1 = (uint)index & 0x3f;
    uVar3 = 0x40 - (ulong)uVar1;
    if (len <= uVar3) {
      uVar3 = len;
    }
    puVar2 = buf + (index >> 6);
    *puVar2 = *puVar2 | (0xffffffffffffffffU >> (-(char)uVar3 & 0x3fU)) << (sbyte)uVar1;
    for (uVar3 = len - uVar3; puVar2 = puVar2 + 1, 0x3f < uVar3; uVar3 = uVar3 - 0x40) {
      *puVar2 = 0xffffffffffffffff;
    }
    if (uVar3 != 0) {
      *puVar2 = *puVar2 | 0xffffffffffffffffU >> (-(char)uVar3 & 0x3fU);
    }
  }
  return;
}

Assistant:

static void _SetBits(size_t* buf, size_t index, size_t len) noexcept {
  if (len == 0)
    return;

  size_t i = index / kBitsPerEntity; // size_t[]
  size_t j = index % kBitsPerEntity; // size_t[][] bit index

  // How many bytes process in the first group.
  size_t c = kBitsPerEntity - j;
  if (c > len)
    c = len;

  // Offset.
  buf += i;

  *buf++ |= ((~(size_t)0) >> (kBitsPerEntity - c)) << j;
  len -= c;

  while (len >= kBitsPerEntity) {
    *buf++ = ~(size_t)0;
    len -= kBitsPerEntity;
  }

  if (len)
    *buf |= ((~(size_t)0) >> (kBitsPerEntity - len));
}